

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcpcpy_s.c
# Opt level: O3

wchar_t * wcpcpy_s(wchar_t *dest,rsize_t dmax,wchar_t *src,errno_t *err)

{
  wchar_t wVar1;
  long lVar2;
  rsize_t rVar3;
  errno_t error;
  errno_t eVar4;
  char *msg;
  wchar_t *pwVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (wchar_t *)0x0) {
    msg = "wcpcpy_s: dest is null";
LAB_00106cdf:
    eVar4 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    msg = "wcpcpy_s: dmax is 0";
    eVar4 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax * 4 < 0x10000001) {
      if (src == (wchar_t *)0x0) {
        *dest = L'\0';
        msg = "wcpcpy_s: src is null";
        goto LAB_00106cdf;
      }
      if (dest != src) {
        pwVar5 = dest;
        if (dest < src) {
          rVar3 = 0;
          do {
            if (pwVar5 == src) goto LAB_00106de1;
            wVar1 = src[rVar3];
            *pwVar5 = wVar1;
            if (wVar1 == L'\0') goto LAB_00106e02;
            pwVar5 = pwVar5 + 1;
            rVar3 = rVar3 + 1;
          } while (dmax != rVar3);
        }
        else {
          do {
            if (src == dest) goto LAB_00106de1;
            wVar1 = *src;
            *pwVar5 = wVar1;
            if (wVar1 == L'\0') goto LAB_00106e02;
            src = src + 1;
            dmax = dmax - 1;
            pwVar5 = pwVar5 + 1;
          } while (dmax != 0);
        }
        *dest = L'\0';
        msg = "wcpcpy_s: not enough space for src";
        eVar4 = 0x196;
        error = 0x196;
        goto LAB_00106d06;
      }
      pwVar5 = dest + dmax;
      eVar4 = 0;
      do {
        if (*dest == L'\0') goto LAB_00106d0b;
        dest = dest + 1;
        dmax = dmax - 1;
      } while (dmax != 0);
      dest = pwVar5;
      if (*pwVar5 == L'\0') goto LAB_00106d0b;
      msg = "wcpcpy_s: no null terminator in dest";
    }
    else {
      msg = "wcpcpy_s: dmax exceeds max";
    }
    eVar4 = 0x193;
    error = 0x193;
  }
  goto LAB_00106d06;
LAB_00106e02:
  eVar4 = 0;
  dest = pwVar5;
  goto LAB_00106d0b;
LAB_00106de1:
  *dest = L'\0';
  msg = "wcpcpy_s: overlapping objects";
  eVar4 = 0x194;
  error = 0x194;
LAB_00106d06:
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
  dest = (wchar_t *)0x0;
LAB_00106d0b:
  *err = eVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return dest;
}

Assistant:

wchar_t *
wcpcpy_s(wchar_t* dest, rsize_t dmax, const wchar_t* src, errno_t *err)
{
    rsize_t orig_dmax;
    wchar_t *orig_dest;
    const wchar_t *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("wcpcpy_s: dest is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("wcpcpy_s: dmax is 0",
                   NULL, ESZEROL);
        *err = RCNEGATE(ESZEROL);
        return NULL;
    }

    if (dmax*sizeof(wchar_t) > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("wcpcpy_s: dmax exceeds max",
                   NULL, ESLEMAX);
        *err = RCNEGATE(ESLEMAX);
        return NULL;
    }

    if (src == NULL) {
#ifdef SAFECLIB_STR_NULL_SLACK
        /* null string to clear data */
        while (dmax) {  *dest = L'\0'; dmax--; dest++; }
#else
        *dest = L'\0';
#endif
        invoke_safe_str_constraint_handler("wcpcpy_s: src is null",
                   NULL, ESNULLP);
        *err = RCNEGATE(ESNULLP);
        return NULL;
    }

    if (dest == src) {
        /* move dest to the end of the string */
        while (dmax && (*dest != L'\0')) { dmax--; dest++; }
        if ( *dest != L'\0' ) {
            invoke_safe_str_constraint_handler("wcpcpy_s: no null terminator in dest",
                               NULL, ESLEMAX);
            *err = RCNEGATE(ESLEMAX);
            return NULL;
        }
        *err = RCNEGATE(EOK);
        return dest;
    }

    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0) {
            if (dest == overlap_bumper) {
                handle_wc_error(orig_dest, orig_dmax, "wcpcpy_s: overlapping objects",
                             ESOVRLP);
                *err = RCNEGATE(ESOVRLP);
                return NULL;
            }

            *dest = *src;
            if (*dest == L'\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = L'\0'; dmax--; dest++; }
#endif
                *err = RCNEGATE(EOK);
                return dest; /* successful return */
            }

            dmax--;
            dest++;
            src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0) {
            if (src == overlap_bumper) {
                handle_wc_error(orig_dest, orig_dmax, "wcpcpy_s: overlapping objects",
                      ESOVRLP);
                *err = RCNEGATE(ESOVRLP);
                return NULL;
            }

            *dest = *src;
            if (*dest == L'\0') {
#ifdef SAFECLIB_STR_NULL_SLACK
                /* null slack to clear any data */
                while (dmax) { *dest = L'\0'; dmax--; dest++; }
#endif
                *err = RCNEGATE(EOK);
                return dest; /* successful return */
            }

            dmax--;
            dest++;
            src++;
        }
    }

    /*
     * the entire src must have been copied, if not reset dest
     * to null the string.
     */
    handle_wc_error(orig_dest, orig_dmax, "wcpcpy_s: not enough space for src",
                 ESNOSPC);
    *err = RCNEGATE(ESNOSPC);
    return NULL;
}